

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzham_pthreads_threading.h
# Opt level: O3

bool __thiscall
lzham::task_pool::
queue_multiple_object_tasks<lzham::search_accelerator,void(lzham::search_accelerator::*)(unsigned_long_long,void*)>
          (task_pool *this,search_accelerator *pObject,
          offset_in_search_accelerator_to_subr pObject_method,uint64 first_data,uint num_tasks,
          void *pData_ptr)

{
  lzham_malloc_context pvVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  task_callback_func p_Var5;
  undefined **ppuVar6;
  undefined4 in_register_00000084;
  uint uVar7;
  uint uVar8;
  ulong uVar9;
  bool bVar10;
  long lVar11;
  void *in_stack_00000008;
  undefined **local_50;
  
  uVar7 = (uint)pData_ptr;
  bVar10 = true;
  if ((uVar7 != 0) && (uVar2 = uVar7 - 1, -1 < (int)uVar2)) {
    uVar8 = 0;
    p_Var5 = (task_callback_func)
             lzham::lzham_malloc((lzham *)this->m_malloc_context,(void *)0x30,0,(ulong *)first_data)
    ;
    if (p_Var5 == (task_callback_func)0x0) {
      bVar10 = false;
    }
    else {
      uVar9 = (ulong)uVar2;
      uVar8 = 0;
      local_50 = &PTR_execute_task_00114d28;
      bVar10 = false;
      do {
        pvVar1 = this->m_malloc_context;
        *(undefined ***)p_Var5 = &PTR_execute_task_00114d28;
        *(lzham_malloc_context *)(p_Var5 + 8) = pvVar1;
        *(search_accelerator **)(p_Var5 + 0x10) = pObject;
        *(offset_in_search_accelerator_to_subr *)(p_Var5 + 0x18) = pObject_method;
        *(uint64 *)(p_Var5 + 0x20) = first_data;
        *(undefined4 *)(p_Var5 + 0x28) = 1;
        ppuVar6 = local_50;
        iVar3 = pthread_spin_lock((pthread_spinlock_t *)this);
        if (iVar3 != 0) {
          lzham_fail("\"spinlock: pthread_spin_lock() failed\"",
                     "/workspace/llm4binary/github/license_c_cmakelists/richgel999[P]lzham_codec_devel/lzhamcomp/lzham_pthreads_threading.h"
                     ,0xf4);
        }
        iVar3 = (this->m_task_stack).m_top;
        lVar11 = (long)iVar3;
        if (lVar11 < 0x40) {
          (this->m_task_stack).m_top = iVar3 + 1;
          ppuVar6 = (undefined **)(lVar11 * 0x20);
          (this->m_task_stack).m_stack[lVar11].m_data =
               CONCAT44(in_register_00000084,num_tasks) + uVar9;
          (this->m_task_stack).m_stack[lVar11].m_pData_ptr = in_stack_00000008;
          (this->m_task_stack).m_stack[lVar11].field_2.m_callback = p_Var5;
          (this->m_task_stack).m_stack[lVar11].m_flags = 1;
        }
        iVar4 = pthread_spin_unlock((pthread_spinlock_t *)this);
        if (iVar4 != 0) {
          lzham_fail("\"spinlock: pthread_spin_unlock() failed\"",
                     "/workspace/llm4binary/github/license_c_cmakelists/richgel999[P]lzham_codec_devel/lzhamcomp/lzham_pthreads_threading.h"
                     ,0xfc);
        }
        if (0x3f < iVar3) break;
        bVar10 = (long)uVar9 < 1;
        if (uVar2 == uVar8) goto LAB_0010fc79;
        uVar9 = uVar9 - 1;
        p_Var5 = (task_callback_func)
                 lzham::lzham_malloc((lzham *)this->m_malloc_context,(void *)0x30,0,(ulong *)ppuVar6
                                    );
        uVar8 = uVar8 + 1;
      } while (p_Var5 != (task_callback_func)0x0);
    }
    uVar7 = uVar8;
    if (uVar8 != 0) {
LAB_0010fc79:
      LOCK();
      this->m_num_outstanding_tasks = this->m_num_outstanding_tasks + (ulong)uVar7;
      UNLOCK();
      lVar11 = (ulong)uVar7 + 1;
      do {
        iVar3 = sem_post((sem_t *)&this->m_tasks_available);
        if (iVar3 != 0) {
          lzham_fail("\"semaphore: sem_post() or sem_post_multiple() failed\"",
                     "/workspace/llm4binary/github/license_c_cmakelists/richgel999[P]lzham_codec_devel/lzhamcomp/lzham_pthreads_threading.h"
                     ,0x9f);
          return bVar10;
        }
        lVar11 = lVar11 + -1;
      } while (1 < lVar11);
    }
  }
  return bVar10;
}

Assistant:

inline bool task_pool::queue_multiple_object_tasks(S* pObject, T pObject_method, uint64 first_data, uint num_tasks, void* pData_ptr)
   {
      LZHAM_ASSERT(m_num_threads);
      LZHAM_ASSERT(pObject);
      LZHAM_ASSERT(num_tasks);
      if (!num_tasks)
         return true;

      bool status = true;

      uint total_to_release = 0;

      for (int i = num_tasks - 1; i >= 0; --i)
      {
         task tsk;

         tsk.m_pObj = lzham_new< object_task<S> >(m_malloc_context, m_malloc_context, pObject, pObject_method, cObjectTaskFlagDeleteAfterExecution);
         if (!tsk.m_pObj)
         {
            status = false;
            break;
         }

         tsk.m_data = first_data + i;
         tsk.m_pData_ptr = pData_ptr;
         tsk.m_flags = cTaskFlagObject;

         if (!m_task_stack.try_push(tsk))
         {
            status = false;
            break;
         }

         total_to_release++;
      }

      if (total_to_release)
      {
         atomic_add32(&m_num_outstanding_tasks, total_to_release);

         m_tasks_available.release(total_to_release);
      }

      return status;
   }